

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O2

void __thiscall ExtPubkey_DerivePubTweakTest_Test::TestBody(ExtPubkey_DerivePubTweakTest_Test *this)

{
  bool bVar1;
  char *message;
  initializer_list<unsigned_int> __l;
  string local_120;
  AssertionResult gtest_ar;
  AssertHelper local_f0;
  ByteData256 tweak_sum;
  vector<unsigned_int,_std::allocator<unsigned_int>_> key_paths;
  string ext_serial;
  ExtPubkey extkey;
  
  std::__cxx11::string::string
            ((string *)&ext_serial,
             "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0"
             ,(allocator *)&extkey);
  cfd::core::ByteData::ByteData((ByteData *)&local_120,&ext_serial);
  cfd::core::ExtPubkey::ExtPubkey(&extkey,(ByteData *)&local_120);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
  local_120._M_dataplus._M_p = (char *)0x500000000;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_120;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&key_paths,__l,(allocator_type *)&tweak_sum);
  cfd::core::ByteData256::ByteData256(&tweak_sum);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ExtPubkey::DerivePubTweak((ByteData256 *)&local_120,&extkey,&key_paths);
      cfd::core::ByteData256::operator=(&tweak_sum,(ByteData256 *)&local_120);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_120);
    }
  }
  else {
    testing::Message::Message((Message *)&local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xbc,
               "Expected: (tweak_sum = extkey.DerivePubTweak(key_paths)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_120);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_120,&tweak_sum);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"2f0b491d070c810a9779a8398063ba6e20302604dc36cf6bf6f935e34c68fa22\"",
             "tweak_sum.GetHex().c_str()",
             "2f0b491d070c810a9779a8398063ba6e20302604dc36cf6bf6f935e34c68fa22",
             local_120._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_120);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xbe,message);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tweak_sum);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&key_paths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  cfd::core::Extkey::~Extkey(&extkey.super_Extkey);
  std::__cxx11::string::~string((string *)&ext_serial);
  return;
}

Assistant:

TEST(ExtPubkey, DerivePubTweakTest) {
  std::string ext_serial = "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0";
  ExtPubkey extkey = ExtPubkey(ByteData(ext_serial));

  std::vector<uint32_t> key_paths = {0, 5};
  ByteData256 tweak_sum;
  EXPECT_NO_THROW((tweak_sum = extkey.DerivePubTweak(key_paths)));
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("2f0b491d070c810a9779a8398063ba6e20302604dc36cf6bf6f935e34c68fa22", tweak_sum.GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS
}